

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::StructPackingPass::findStructIdByName(StructPackingPass *this,char *structName)

{
  Module *pMVar1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  Operand *pOVar4;
  Instruction **ppIVar5;
  string local_50;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar5 = (Instruction **)
            ((long)&(pMVar1->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    this_00 = *ppIVar5;
    if (this_00 ==
        (Instruction *)
        ((long)&(pMVar1->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
      return 0;
    }
    if (this_00->opcode_ == OpName) {
      pOVar4 = Instruction::GetOperand(this_00,1);
      Operand::AsString_abi_cxx11_(&local_50,pOVar4);
      bVar2 = std::operator==(&local_50,structName);
      std::__cxx11::string::_M_dispose();
      if (bVar2) {
        pOVar4 = Instruction::GetOperand(this_00,0);
        uVar3 = Operand::AsId(pOVar4);
        return uVar3;
      }
    }
    ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

uint32_t StructPackingPass::findStructIdByName(const char* structName) const {
  for (Instruction& instr : context()->module()->debugs2()) {
    if (instr.opcode() == spv::Op::OpName &&
        instr.GetOperand(1).AsString() == structName) {
      return instr.GetOperand(0).AsId();
    }
  }
  return 0;
}